

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilityTests.cpp
# Opt level: O3

void __thiscall
IndexIntervalTest_ValuesSetInConstructor_Test::TestBody
          (IndexIntervalTest_ValuesSetInConstructor_Test *this)

{
  Int3 *_begin;
  Int3 *_end;
  Int3 *_step;
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  IndexInterval<pica::Vector3<int>_> interval;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  AssertHelper local_88;
  internal local_80 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  IndexInterval<pica::Vector3<int>_> local_6c;
  
  _begin = &(this->super_IndexIntervalTest).begin;
  _end = &(this->super_IndexIntervalTest).end;
  _step = &(this->super_IndexIntervalTest).step;
  pica::IndexInterval<pica::Vector3<int>_>::IndexInterval(&local_6c,_begin,_end,_step);
  testing::internal::CmpHelperEQ<int,int>
            (local_80,"begin.x","interval.begin.x",&_begin->x,(int *)&local_6c);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
               ,0x73,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_90.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_90.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_90.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperEQ<int,int>
              (local_80,"begin.y","interval.begin.y",&(this->super_IndexIntervalTest).begin.y,
               &local_6c.begin.y);
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_90);
      if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
                 ,0x73,pcVar2);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if (local_90.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_90.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_90.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperEQ<int,int>
                (local_80,"begin.z","interval.begin.z",&(this->super_IndexIntervalTest).begin.z,
                 &local_6c.begin.z);
      if (local_80[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_90);
        if (local_78.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
                   ,0x73,pcVar2);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_90.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_90.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_90.ptr_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperEQ<int,int>
                  (local_80,"end.x","interval.end.x",&_end->x,&local_6c.end.x);
        if (local_80[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_90);
          if (local_78.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
                     ,0x74,pcVar2);
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          if (local_90.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_90.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_90.ptr_ + 8))();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          testing::internal::CmpHelperEQ<int,int>
                    (local_80,"end.y","interval.end.y",&(this->super_IndexIntervalTest).end.y,
                     &local_6c.end.y);
          if (local_80[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_90);
            if (local_78.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_88,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
                       ,0x74,pcVar2);
            testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
            testing::internal::AssertHelper::~AssertHelper(&local_88);
            if (local_90.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) &&
                 (local_90.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_90.ptr_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_78,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_78,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperEQ<int,int>
                      (local_80,"end.z","interval.end.z",&(this->super_IndexIntervalTest).end.z,
                       &local_6c.end.z);
            if (local_80[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_90);
              if (local_78.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_88,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
                         ,0x74,pcVar2);
              testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
              testing::internal::AssertHelper::~AssertHelper(&local_88);
              if (local_90.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) &&
                   (local_90.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_90.ptr_ + 8))();
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&local_78,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&local_78,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              testing::internal::CmpHelperEQ<int,int>
                        (local_80,"step.x","interval.step.x",&_step->x,&local_6c.step.x);
              if (local_80[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_90);
                if (local_78.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_88,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
                           ,0x75,pcVar2);
                testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
                testing::internal::AssertHelper::~AssertHelper(&local_88);
                if (local_90.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) &&
                     (local_90.ptr_ !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     )) {
                    (**(code **)(*(long *)local_90.ptr_ + 8))();
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset(&local_78,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset(&local_78,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                testing::internal::CmpHelperEQ<int,int>
                          (local_80,"step.y","interval.step.y",
                           &(this->super_IndexIntervalTest).step.y,&local_6c.step.y);
                if (local_80[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_90);
                  if (local_78.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_88,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
                             ,0x75,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
                  testing::internal::AssertHelper::~AssertHelper(&local_88);
                  if (local_90.ptr_ !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    bVar1 = testing::internal::IsTrue(true);
                    if ((bVar1) &&
                       (local_90.ptr_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0)) {
                      (**(code **)(*(long *)local_90.ptr_ + 8))();
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_78,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_78,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  testing::internal::CmpHelperEQ<int,int>
                            (local_80,"step.z","interval.step.z",
                             &(this->super_IndexIntervalTest).step.z,&local_6c.step.z);
                  if (local_80[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_90);
                    if (local_78.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_88,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
                               ,0x75,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
                    testing::internal::AssertHelper::~AssertHelper(&local_88);
                    if (local_90.ptr_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      bVar1 = testing::internal::IsTrue(true);
                      if ((bVar1) &&
                         (local_90.ptr_ !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0)) {
                        (**(code **)(*(long *)local_90.ptr_ + 8))();
                      }
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_78,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(IndexIntervalTest, ValuesSetInConstructor)
{
    IndexInterval<Int3> interval(begin, end, step);
    ASSERT_EQ_INT3(begin, interval.begin);
    ASSERT_EQ_INT3(end, interval.end);
    ASSERT_EQ_INT3(step, interval.step);
}